

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

Vector * VectorBarycentricCoordinateWeight(Vector v,Vector v1,Vector v2,Vector v3)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  Vector *in_RDI;
  longdouble lVar5;
  undefined8 in_stack_00000008;
  
  lVar3 = (longdouble)CONCAT28(v2.x._0_2_,v1.z._8_8_);
  lVar4 = (longdouble)CONCAT28(v3.x._0_2_,v2.z._8_8_);
  lVar1 = (longdouble)CONCAT28(v.x._0_2_,in_stack_00000008);
  lVar2 = (longdouble)CONCAT28(v1.x._0_2_,v.z._8_8_);
  lVar5 = (((lVar3 * (longdouble)v1._8_10_ - lVar4 * (longdouble)v1._8_10_) -
           (longdouble)v2._8_10_ * lVar2) + lVar4 * (longdouble)v2._8_10_ +
          (longdouble)v3._8_10_ * lVar2) - lVar3 * (longdouble)v3._8_10_;
  *(longdouble *)&in_RDI->x =
       -((((lVar1 * (longdouble)v2._8_10_ +
           ((longdouble)v._8_10_ * lVar4 - (longdouble)v._8_10_ * lVar3)) -
          lVar4 * (longdouble)v2._8_10_) - lVar1 * (longdouble)v3._8_10_) +
        lVar3 * (longdouble)v3._8_10_) / lVar5;
  *(longdouble *)&in_RDI->y =
       -((lVar1 * (longdouble)v3._8_10_ +
         lVar4 * (longdouble)v1._8_10_ +
         (((longdouble)v._8_10_ * lVar2 - (longdouble)v._8_10_ * lVar4) -
         lVar1 * (longdouble)v1._8_10_)) - (longdouble)v3._8_10_ * lVar2) / lVar5;
  *(longdouble *)&in_RDI->z =
       -((longdouble)v2._8_10_ * lVar2 +
        (((lVar1 * (longdouble)v1._8_10_ +
          ((longdouble)v._8_10_ * lVar3 - (longdouble)v._8_10_ * lVar2)) -
         lVar3 * (longdouble)v1._8_10_) - lVar1 * (longdouble)v2._8_10_)) / lVar5;
  return in_RDI;
}

Assistant:

Vector VectorBarycentricCoordinateWeight(const Vector v, const Vector v1, const Vector v2, const Vector v3) {
  Real w1 = -((-v2.x * v.y + v3.x * v.y + v.x * v2.y - v3.x * v2.y - v.x * v3.y + v2.x * v3.y) / (v2.x * v1.y - v3.x * v1.y - v1.x * v2.y + v3.x * v2.y + v1.x * v3.y - v2.x * v3.y));
  Real w2 = -((v1.x * v.y - v3.x * v.y - v.x * v1.y + v3.x * v1.y + v.x * v3.y - v1.x * v3.y) / (v2.x * v1.y - v3.x * v1.y - v1.x * v2.y + v3.x * v2.y + v1.x * v3.y - v2.x * v3.y));
  Real w3 = -((-v1.x * v.y + v2.x * v.y + v.x * v1.y - v2.x * v1.y - v.x * v2.y + v1.x * v2.y) / (v2.x * v1.y - v3.x * v1.y - v1.x * v2.y + v3.x * v2.y + v1.x * v3.y - v2.x * v3.y));
  return V(w1, w2, w3);
}